

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_MovePlayer(player_t *player)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  ticcmd_t *ptVar6;
  FILE *__stream;
  unsigned_short uVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  char local_c9;
  double local_a0;
  bool local_91;
  long *local_90;
  msecnode_t *n;
  TAngle<double> local_80;
  TAngle<double> local_78;
  TAngle<double> local_70;
  TFlags<ActorFlag,_unsigned_int> local_64;
  double local_60;
  double sm;
  double fm;
  double movefactor;
  double friction;
  double bobfactor;
  double sidemove;
  double forwardmove;
  APlayerPawn *local_20;
  APlayerPawn *mo;
  ticcmd_t *cmd;
  player_t *player_local;
  
  mo = (APlayerPawn *)&player->cmd;
  local_20 = player->mo;
  cmd = (ticcmd_t *)player;
  if (player->turnticks == '\0') {
    TAngle<double>::operator+=
              (&(local_20->super_AActor).Angles.Yaw,
               (double)(int)(player->cmd).ucmd.yaw * 0.0054931640625);
  }
  else {
    player->turnticks = player->turnticks + 0xff;
    TAngle<double>::operator+=(&(local_20->super_AActor).Angles.Yaw,20.0);
  }
  dVar10 = AActor::Z(&local_20->super_AActor);
  local_91 = true;
  if ((local_20->super_AActor).floorz < dVar10) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)((long)&forwardmove + 4),
               (int)local_20 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar8 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&forwardmove + 4));
    local_91 = true;
    if (uVar8 == 0) {
      TFlags<ActorBounceFlag,_unsigned_short>::operator&
                ((TFlags<ActorBounceFlag,_unsigned_short> *)((long)&forwardmove + 2),
                 (int)local_20 +
                 (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|BOUNCE_Actors)
                );
      uVar7 = TFlags::operator_cast_to_unsigned_short((TFlags *)((long)&forwardmove + 2));
      local_91 = true;
      if (uVar7 == 0) {
        uVar8._0_2_ = cmd[0xb].ucmd.sidemove;
        uVar8._2_2_ = cmd[0xb].ucmd.upmove;
        local_91 = (uVar8 & 0x40000000) != 0;
      }
    }
  }
  *(bool *)&cmd[0x12].ucmd.roll = local_91;
  if (*(short *)((long)&(mo->super_AActor).super_DThinker.super_DObject.Class + 2) != 0 ||
      *(short *)((long)&(mo->super_AActor).super_DThinker.super_DObject.Class + 4) != 0) {
    fm = P_GetMoveFactor(&local_20->super_AActor,&movefactor);
    local_a0 = fm;
    if (0.90625 <= movefactor) {
      local_a0 = 0.03125;
    }
    friction = local_a0;
    bVar9 = false;
    if ((cmd[0x12].ucmd.roll & 1) == 0) {
      uVar5 = (cmd->ucmd).buttons;
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_64,
                 uVar5 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar8 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
      bVar9 = false;
      if (uVar8 == 0) {
        bVar9 = *(int *)(*(long *)&cmd->ucmd + 0x2d0) == 0;
      }
    }
    if (bVar9) {
      fm = level.aircontrol * fm;
      friction = level.aircontrol * friction;
    }
    sm = (double)(int)*(short *)((long)&(mo->super_AActor).super_DThinker.super_DObject.Class + 2);
    local_60 = (double)(int)*(short *)((long)&(mo->super_AActor).super_DThinker.super_DObject.Class
                                      + 4);
    APlayerPawn::TweakSpeeds(local_20,&sm,&local_60);
    sm = (*(double *)(*(long *)&cmd->ucmd + 0xe0) / 256.0) * sm;
    local_60 = (*(double *)(*(long *)&cmd->ucmd + 0xe0) / 256.0) * local_60;
    bVar9 = player_t::CanCrouch((player_t *)cmd);
    ptVar6 = cmd;
    if ((bVar9) &&
       ((*(double *)&cmd[0x16].consistancy != 1.0 || (NAN(*(double *)&cmd[0x16].consistancy))))) {
      sm = *(double *)&cmd[0x16].consistancy * sm;
      local_60 = *(double *)&cmd[0x16].consistancy * local_60;
      friction = *(double *)&cmd[0x16].consistancy * friction;
    }
    sidemove = sm * fm * 1.0;
    bobfactor = local_60 * fm * 1.0;
    if ((sidemove != 0.0) || (NAN(sidemove))) {
      TAngle<double>::TAngle(&local_70,&(local_20->super_AActor).Angles.Yaw);
      P_Bob((player_t *)ptVar6,&local_70,
            ((double)(int)*(short *)((long)&(mo->super_AActor).super_DThinker.super_DObject.Class +
                                    2) * friction) / 256.0,true);
      ptVar6 = cmd;
      TAngle<double>::TAngle(&local_78,&(local_20->super_AActor).Angles.Yaw);
      P_ForwardThrust((player_t *)ptVar6,&local_78,sidemove);
    }
    ptVar6 = cmd;
    if ((bobfactor != 0.0) || (NAN(bobfactor))) {
      TAngle<double>::operator-(&local_80,90.0);
      P_Bob((player_t *)ptVar6,&local_80,
            ((double)(int)*(short *)((long)&(mo->super_AActor).super_DThinker.super_DObject.Class +
                                    4) * friction) / 256.0,false);
      ptVar6 = cmd;
      TAngle<double>::TAngle((TAngle<double> *)&n,&(local_20->super_AActor).Angles.Yaw);
      P_SideThrust((player_t *)ptVar6,(DAngle *)&n,bobfactor);
    }
    __stream = debugfile;
    if (debugfile != (FILE *)0x0) {
      ptVar6 = cmd + -0x1585a4;
      uVar1._0_2_ = cmd[0xb].ucmd.sidemove;
      uVar1._2_2_ = cmd[0xb].ucmd.upmove;
      local_c9 = 'p';
      if ((uVar1 & 0x2000) == 0) {
        local_c9 = ' ';
      }
      dVar10 = AActor::X(*(AActor **)&cmd->ucmd);
      dVar11 = AActor::Y(*(AActor **)&cmd->ucmd);
      dVar12 = AActor::Z(*(AActor **)&cmd->ucmd);
      fprintf((FILE *)__stream,"move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [",dVar10,
              dVar11,SUB84(dVar12,0),sidemove,bobfactor,fm,movefactor,
              (long)&ptVar6->consistancy / 0x2a0 & 0xffffffff,(ulong)(uint)(int)local_c9,
              (ulong)*(uint *)(*(long *)&cmd->ucmd + 0x2d0));
      for (local_90 = *(long **)(*(long *)&cmd->ucmd + 0x388); local_90 != (long *)0x0;
          local_90 = (long *)local_90[3]) {
        fprintf((FILE *)debugfile,"%td ",(*local_90 - (long)sectors) / 0x218);
      }
      fprintf((FILE *)debugfile,"]\n");
    }
    uVar2._0_2_ = cmd[0xb].ucmd.sidemove;
    uVar2._2_2_ = cmd[0xb].ucmd.upmove;
    if (((uVar2 & 0x2000) == 0) &&
       ((((sidemove != 0.0 || (NAN(sidemove))) || (bobfactor != 0.0)) || (NAN(bobfactor))))) {
      APlayerPawn::PlayRunning(*(APlayerPawn **)&cmd->ucmd);
    }
    uVar3._0_2_ = cmd[0xb].ucmd.sidemove;
    uVar3._2_2_ = cmd[0xb].ucmd.upmove;
    if ((uVar3 & 0x80) != 0) {
      uVar4._0_2_ = cmd[0xb].ucmd.sidemove;
      uVar4._2_2_ = cmd[0xb].ucmd.upmove;
      cmd[0xb].ucmd.sidemove = (short)(uVar4 & 0xffffff7f);
      cmd[0xb].ucmd.upmove = (short)((uVar4 & 0xffffff7f) >> 0x10);
      TObjPtr<AActor>::operator=((TObjPtr<AActor> *)&cmd[0x12].consistancy,*(AActor **)&cmd->ucmd);
    }
  }
  return;
}

Assistant:

void P_MovePlayer (player_t *player)
{
	ticcmd_t *cmd = &player->cmd;
	APlayerPawn *mo = player->mo;

	// [RH] 180-degree turn overrides all other yaws
	if (player->turnticks)
	{
		player->turnticks--;
		mo->Angles.Yaw += (180. / TURN180_TICKS);
	}
	else
	{
		mo->Angles.Yaw += cmd->ucmd.yaw * (360./65536.);
	}

	player->onground = (mo->Z() <= mo->floorz) || (mo->flags2 & MF2_ONMOBJ) || (mo->BounceFlags & BOUNCE_MBF) || (player->cheats & CF_NOCLIP2);

	// killough 10/98:
	//
	// We must apply thrust to the player and bobbing separately, to avoid
	// anomalies. The thrust applied to bobbing is always the same strength on
	// ice, because the player still "works just as hard" to move, while the
	// thrust applied to the movement varies with 'movefactor'.

	if (cmd->ucmd.forwardmove | cmd->ucmd.sidemove)
	{
		double forwardmove, sidemove;
		double bobfactor;
		double friction, movefactor;
		double fm, sm;

		movefactor = P_GetMoveFactor (mo, &friction);
		bobfactor = friction < ORIG_FRICTION ? movefactor : ORIG_FRICTION_FACTOR;
		if (!player->onground && !(player->mo->flags & MF_NOGRAVITY) && !player->mo->waterlevel)
		{
			// [RH] allow very limited movement if not on ground.
			movefactor *= level.aircontrol;
			bobfactor*= level.aircontrol;
		}

		fm = cmd->ucmd.forwardmove;
		sm = cmd->ucmd.sidemove;
		mo->TweakSpeeds (fm, sm);
		fm *= player->mo->Speed / 256;
		sm *= player->mo->Speed / 256;

		// When crouching, speed and bobbing have to be reduced
		if (player->CanCrouch() && player->crouchfactor != 1)
		{
			fm *= player->crouchfactor;
			sm *= player->crouchfactor;
			bobfactor *= player->crouchfactor;
		}

		forwardmove = fm * movefactor * (35 / TICRATE);
		sidemove = sm * movefactor * (35 / TICRATE);

		if (forwardmove)
		{
			P_Bob(player, mo->Angles.Yaw, cmd->ucmd.forwardmove * bobfactor / 256., true);
			P_ForwardThrust(player, mo->Angles.Yaw, forwardmove);
		}
		if (sidemove)
		{
			P_Bob(player, mo->Angles.Yaw - 90, cmd->ucmd.sidemove * bobfactor / 256., false);
			P_SideThrust(player, mo->Angles.Yaw, sidemove);
		}

		if (debugfile)
		{
			fprintf (debugfile, "move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [", int(player-players),
				player->cheats&CF_PREDICTING?'p':' ',
				player->mo->X(), player->mo->Y(), player->mo->Z(),forwardmove, sidemove, movefactor, friction, player->mo->waterlevel);
			msecnode_t *n = player->mo->touching_sectorlist;
			while (n != NULL)
			{
				fprintf (debugfile, "%td ", n->m_sector-sectors);
				n = n->m_tnext;
			}
			fprintf (debugfile, "]\n");
		}

		if (!(player->cheats & CF_PREDICTING) && (forwardmove != 0 || sidemove != 0))
		{
			player->mo->PlayRunning ();
		}

		if (player->cheats & CF_REVERTPLEASE)
		{
			player->cheats &= ~CF_REVERTPLEASE;
			player->camera = player->mo;
		}
	}
}